

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O3

void __thiscall
Wasm::WasmBinaryReader::WasmBinaryReader
          (WasmBinaryReader *this,ArenaAllocator *alloc,WebAssemblyModule *module,byte *source,
          size_t length)

{
  BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_00;
  
  (this->super_WasmReaderBase)._vptr_WasmReaderBase = (_func_int **)&PTR_SeekToFunctionBody_01543950
  ;
  this->m_alloc = alloc;
  this->m_start = source;
  this->m_end = source + length;
  this->m_pc = source;
  this->m_readerState = READER_STATE_UNKNOWN;
  this->m_curFuncEnd = (byte *)0x0;
  *(undefined8 *)&this->m_currentSection = 0;
  (this->m_currentSection).start = (byte *)0x0;
  (this->m_currentSection).end = (byte *)0x0;
  *(undefined8 *)&(this->m_currentSection).nameLength = 0;
  (this->m_currentSection).name = (char16 *)0x0;
  (this->m_funcState).body = (FunctionBody *)0x0;
  this->m_module = module;
  this->m_ops = (OpSet *)0x0;
  (this->m_currentSection).code = bSectLimit;
  this_00 = (BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             *)new<Memory::ArenaAllocator>(0x38,alloc,0x364470);
  JsUtil::
  BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(this_00,this->m_alloc,0);
  this->m_ops = (OpSet *)this_00;
  return;
}

Assistant:

WasmBinaryReader::WasmBinaryReader(ArenaAllocator* alloc, Js::WebAssemblyModule* module, const byte* source, size_t length) :
    m_alloc(alloc),
    m_start(source),
    m_end(source + length),
    m_pc(source),
    m_curFuncEnd(nullptr),
    m_currentSection(),
    m_readerState(READER_STATE_UNKNOWN),
    m_module(module)
#if DBG_DUMP
    , m_ops(nullptr)
#endif
{
    m_currentSection.code = bSectLimit;
#if DBG_DUMP
    m_ops = Anew(m_alloc, OpSet, m_alloc);
#endif
}